

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *__s2;
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  ImDrawCmd *pIVar8;
  ImDrawChannel *pIVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  int i;
  int i_00;
  ulong uVar12;
  long lVar13;
  unsigned_short *__dest;
  int iVar14;
  int iVar15;
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    ImDrawList::_PopUnusedDrawCmd(draw_list);
    if ((this->_Count < 1) || ((draw_list->CmdBuffer).Size < 1)) {
      pIVar8 = (ImDrawCmd *)0x0;
      iVar11 = 0;
    }
    else {
      pIVar8 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
      iVar11 = pIVar8->ElemCount + pIVar8->IdxOffset;
    }
    iVar14 = 0;
    iVar15 = 0;
    for (i_00 = 1; i_00 < this->_Count; i_00 = i_00 + 1) {
      pIVar9 = ImVector<ImDrawChannel>::operator[](&this->_Channels,i_00);
      if ((0 < (pIVar9->_CmdBuffer).Size) &&
         (pIVar10 = ImVector<ImDrawCmd>::back(&pIVar9->_CmdBuffer), pIVar10->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back(&pIVar9->_CmdBuffer);
      }
      uVar7 = (pIVar9->_CmdBuffer).Size;
      if (pIVar8 != (ImDrawCmd *)0x0 && 0 < (int)uVar7) {
        pIVar10 = ImVector<ImDrawCmd>::operator[](&pIVar9->_CmdBuffer,0);
        iVar6 = bcmp(pIVar8,pIVar10,0x1c);
        if ((iVar6 == 0) &&
           (pIVar10->UserCallback == (ImDrawCallback)0x0 &&
            pIVar8->UserCallback == (ImDrawCallback)0x0)) {
          pIVar8->ElemCount = pIVar8->ElemCount + pIVar10->ElemCount;
          iVar11 = iVar11 + pIVar10->ElemCount;
          ImVector<ImDrawCmd>::erase(&pIVar9->_CmdBuffer,(pIVar9->_CmdBuffer).Data);
        }
        uVar7 = (pIVar9->_CmdBuffer).Size;
      }
      if (0 < (int)uVar7) {
        pIVar8 = ImVector<ImDrawCmd>::back(&pIVar9->_CmdBuffer);
        uVar7 = (pIVar9->_CmdBuffer).Size;
      }
      iVar6 = (pIVar9->_IdxBuffer).Size;
      pIVar10 = (pIVar9->_CmdBuffer).Data;
      uVar12 = 0;
      if (0 < (int)uVar7) {
        uVar12 = (ulong)uVar7;
      }
      for (lVar13 = 0; uVar12 * 0x38 - lVar13 != 0; lVar13 = lVar13 + 0x38) {
        *(int *)((long)&pIVar10->IdxOffset + lVar13) = iVar11;
        iVar11 = iVar11 + *(int *)((long)&pIVar10->ElemCount + lVar13);
      }
      iVar14 = iVar14 + uVar7;
      iVar15 = iVar15 + iVar6;
    }
    ImVector<ImDrawCmd>::resize(&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + iVar14);
    ImVector<unsigned_short>::resize(&draw_list->IdxBuffer,(draw_list->IdxBuffer).Size + iVar15);
    pIVar8 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar14);
    __dest = (draw_list->IdxBuffer).Data + ((long)(draw_list->IdxBuffer).Size - (long)iVar15);
    for (iVar11 = 1; iVar11 < this->_Count; iVar11 = iVar11 + 1) {
      pIVar9 = ImVector<ImDrawChannel>::operator[](&this->_Channels,iVar11);
      lVar13 = (long)(pIVar9->_CmdBuffer).Size;
      if (lVar13 != 0) {
        memcpy(pIVar8,(pIVar9->_CmdBuffer).Data,lVar13 * 0x38);
        pIVar8 = pIVar8 + lVar13;
      }
      lVar13 = (long)(pIVar9->_IdxBuffer).Size;
      if (lVar13 != 0) {
        memcpy(__dest,(pIVar9->_IdxBuffer).Data,lVar13 * 2);
        __dest = __dest + lVar13;
      }
    }
    draw_list->_IdxWritePtr = __dest;
    if (((draw_list->CmdBuffer).Size == 0) ||
       (pIVar8 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer),
       pIVar8->UserCallback != (ImDrawCallback)0x0)) {
      ImDrawList::AddDrawCmd(draw_list);
    }
    pIVar8 = (draw_list->CmdBuffer).Data;
    iVar11 = (draw_list->CmdBuffer).Size;
    pIVar10 = pIVar8 + (long)iVar11 + -1;
    __s2 = &draw_list->_CmdHeader;
    if (pIVar8[(long)iVar11 + -1].ElemCount == 0) {
      fVar2 = (__s2->ClipRect).x;
      fVar3 = (__s2->ClipRect).y;
      fVar4 = (draw_list->_CmdHeader).ClipRect.z;
      fVar5 = (draw_list->_CmdHeader).ClipRect.w;
      uVar1 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&pIVar8[(long)iVar11 + -1].ClipRect.w =
           *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar8[(long)iVar11 + -1].TextureId + 4) = uVar1;
      (pIVar10->ClipRect).x = fVar2;
      (pIVar10->ClipRect).y = fVar3;
      pIVar8[(long)iVar11 + -1].ClipRect.z = fVar4;
      pIVar8[(long)iVar11 + -1].ClipRect.w = fVar5;
    }
    else {
      iVar11 = bcmp(pIVar10,__s2,0x1c);
      if (iVar11 != 0) {
        ImDrawList::AddDrawCmd(draw_list);
      }
    }
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}